

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O0

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>::X<Fad<double>>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *result)

{
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *x;
  double *pdVar1;
  TPZVec<Fad<double>_> *in_RCX;
  Fad<double> *in_RDI;
  int i_1;
  int i;
  Fad<double> norm;
  TPZManVector<Fad<double>,_3> xqsiLxc;
  TPZManVector<Fad<double>,_3> xqsi;
  TPZVec<Fad<double>_> *in_stack_00001a08;
  TPZVec<Fad<double>_> *in_stack_00001a10;
  TPZFMatrix<double> *in_stack_00001a18;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_00001a20;
  Fad<double> *in_stack_fffffffffffffd70;
  double *in_stack_fffffffffffffd78;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffd80;
  Fad<double> *in_stack_fffffffffffffd88;
  Fad<double> *in_stack_fffffffffffffd90;
  Fad<double> *x_00;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
  *in_stack_fffffffffffffdb0;
  double in_stack_fffffffffffffdb8;
  double in_stack_fffffffffffffdc0;
  Fad<double> *in_stack_fffffffffffffdc8;
  int local_204;
  Fad<double> *in_stack_fffffffffffffe10;
  int64_t in_stack_fffffffffffffe18;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffe20;
  int local_1ac;
  TPZManVector<Fad<double>,_3> local_158;
  undefined8 local_c8;
  Fad<double> local_c0;
  TPZVec<Fad<double>_> local_a0 [4];
  TPZVec<Fad<double>_> *local_20;
  
  local_c8 = 0;
  x_00 = &local_c0;
  local_20 = in_RCX;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  Fad<double>::~Fad(in_stack_fffffffffffffd70);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  Fad<double>::~Fad(in_stack_fffffffffffffd70);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<Fad<double>>
            (in_stack_00001a20,in_stack_00001a18,in_stack_00001a10,in_stack_00001a08);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
    in_stack_fffffffffffffd90 = TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1ac);
    x = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)
        TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[0x54].dx_,(long)local_1ac);
    operator-<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    TPZVec<Fad<double>_>::operator[](&local_158.super_TPZVec<Fad<double>_>,(long)local_1ac);
    Fad<double>::operator=
              (in_stack_fffffffffffffd90,
               (FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffd88);
    FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd80 = &local_158;
    in_stack_fffffffffffffd88 =
         TPZVec<Fad<double>_>::operator[]
                   (&in_stack_fffffffffffffd80->super_TPZVec<Fad<double>_>,(long)local_1ac);
    TPZVec<Fad<double>_>::operator[]
              (&in_stack_fffffffffffffd80->super_TPZVec<Fad<double>_>,(long)local_1ac);
    operator*<Fad<double>,_Fad<double>,_nullptr>(x_00,in_RDI);
    Fad<double>::operator+=(in_RDI,x);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffd70);
  }
  sqrt<double>(x_00);
  Fad<double>::operator=
            (in_stack_fffffffffffffd90,
             (FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffffd88);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffffd70);
  for (local_204 = 0; local_204 < 3; local_204 = local_204 + 1) {
    pdVar1 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI[0x54].dx_,(long)local_204);
    in_stack_fffffffffffffd70 = (Fad<double> *)*pdVar1;
    TPZVec<Fad<double>_>::operator[](&local_158.super_TPZVec<Fad<double>_>,(long)local_204);
    operator*<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)x_00,in_RDI);
    operator+<double,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    TPZVec<Fad<double>_>::operator[](local_20,(long)local_204);
    Fad<double>::operator=
              (in_stack_fffffffffffffd90,
               (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffffd88);
    FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_fffffffffffffd70);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffd70);
    FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffd70);
  }
  Fad<double>::~Fad(in_stack_fffffffffffffd70);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffd80);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffd80);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
		{
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,loc,xqsi); // gives the map (qsi,eta) to (x,y,z)
            
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            for (int i = 0; i < 3; i++) {
                result[i] = fxc[i] + xqsiLxc[i] * fR / norm;
            }
                
            
		}